

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::add_blocked_sample
          (TypedTimeSamples<tinyusdz::value::matrix4d> *this,double t)

{
  undefined1 local_a8 [8];
  Sample s;
  double t_local;
  TypedTimeSamples<tinyusdz::value::matrix4d> *this_local;
  
  s._136_8_ = t;
  Sample::Sample((Sample *)local_a8);
  local_a8 = (undefined1  [8])s._136_8_;
  s.value.m[3][3]._0_1_ = 1;
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>>
              *)this,(Sample *)local_a8);
  this->_dirty = true;
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }